

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

size_t multissl_version(char *buffer,size_t size)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  Curl_ssl *local_118;
  char local_108 [7];
  _Bool paren;
  char vb [200];
  int i;
  char *end;
  char *p;
  Curl_ssl *current;
  size_t size_local;
  char *buffer_local;
  
  if (Curl_ssl == &Curl_ssl_multi) {
    local_118 = available_backends[0];
  }
  else {
    local_118 = Curl_ssl;
  }
  if (local_118 != multissl_version::selected) {
    end = multissl_version::backends;
    multissl_version::selected = local_118;
    multissl_version::backends[0] = '\0';
    vb[0xc4] = '\0';
    vb[0xc5] = '\0';
    vb[0xc6] = '\0';
    vb[199] = '\0';
    for (; available_backends[(int)vb._196_4_] != (Curl_ssl *)0x0; vb._196_4_ = vb._196_4_ + 1) {
      bVar6 = multissl_version::selected != available_backends[(int)vb._196_4_];
      sVar2 = (*available_backends[(int)vb._196_4_]->version)(local_108,200);
      if (sVar2 != 0) {
        pcVar4 = "";
        if (end != multissl_version::backends) {
          pcVar4 = " ";
        }
        pcVar5 = "";
        if (bVar6) {
          pcVar5 = "(";
        }
        pcVar3 = "";
        if (bVar6) {
          pcVar3 = ")";
        }
        iVar1 = curl_msnprintf(end,(long)&multissl_version::backends_len - (long)end,"%s%s%s%s",
                               pcVar4,pcVar5,local_108,pcVar3);
        end = end + iVar1;
      }
    }
    multissl_version::backends_len = (size_t)(end + -0x1121180);
  }
  if (size == 0) {
    buffer_local = (char *)0x0;
  }
  else if (multissl_version::backends_len < size) {
    strcpy(buffer,multissl_version::backends);
    buffer_local = (char *)multissl_version::backends_len;
  }
  else {
    strncpy(buffer,multissl_version::backends,size - 1);
    buffer[size - 1] = '\0';
    buffer_local = (char *)(size - 1);
  }
  return (size_t)buffer_local;
}

Assistant:

static size_t multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t backends_len;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    char *end = backends + sizeof(backends);
    int i;

    selected = current;

    backends[0] = '\0';

    for(i = 0; available_backends[i]; ++i) {
      char vb[200];
      bool paren = (selected != available_backends[i]);

      if(available_backends[i]->version(vb, sizeof(vb))) {
        p += msnprintf(p, end - p, "%s%s%s%s", (p != backends ? " " : ""),
                       (paren ? "(" : ""), vb, (paren ? ")" : ""));
      }
    }

    backends_len = p - backends;
  }

  if(!size)
    return 0;

  if(size <= backends_len) {
    strncpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
    return size - 1;
  }

  strcpy(buffer, backends);
  return backends_len;
}